

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeStringConstructor
               (DynamicObject *stringConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Type *builtInFuncs;
  Var value;
  DynamicObject **ppDVar2;
  PropertyString *value_00;
  JavascriptFunction *pJVar3;
  ScriptConfiguration *this_01;
  Type *builtinFuncs;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *stringConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,stringConstructor,mode,6,0);
  this = RecyclableObject::GetLibrary(&stringConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&stringConstructor->super_RecyclableObject);
  builtInFuncs = GetBuiltinFunctions(this);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this,stringConstructor,0xd1,value,'\x02');
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).stringPrototype);
  AddMember(this,stringConstructor,0x124,*ppDVar2,'\0');
  value_00 = ScriptContext::GetPropertyString(this_00,0x15c);
  AddMember(this,stringConstructor,0x106,value_00,'\x02');
  pJVar3 = AddFunctionToLibraryObject
                     (this,stringConstructor,0x96,
                      (FunctionInfo *)JavascriptString::EntryInfo::FromCharCode,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0xb,pJVar3);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_01);
  if (bVar1) {
    pJVar3 = AddFunctionToLibraryObject
                       (this,stringConstructor,0x97,
                        (FunctionInfo *)JavascriptString::EntryInfo::FromCodePoint,1,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0xc,pJVar3);
  }
  AddFunctionToLibraryObject
            (this,stringConstructor,0x12a,(FunctionInfo *)JavascriptString::EntryInfo::Raw,1,'\x06')
  ;
  CheckRegisteredBuiltIns(builtInFuncs,this_00);
  DynamicObject::SetHasNoEnumerableProperties(stringConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeStringConstructor(DynamicObject* stringConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(stringConstructor, mode, 6);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterString
        // so that the update is in sync with profiler
        JavascriptLibrary* library = stringConstructor->GetLibrary();
        ScriptContext* scriptContext = stringConstructor->GetScriptContext();

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();
        library->AddMember(stringConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(stringConstructor, PropertyIds::prototype, library->stringPrototype, PropertyNone);
        library->AddMember(stringConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::String), PropertyConfigurable);

        builtinFuncs[BuiltinFunction::JavascriptString_FromCharCode]  = library->AddFunctionToLibraryObject(stringConstructor, PropertyIds::fromCharCode,  &JavascriptString::EntryInfo::FromCharCode,  1);
        if(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            builtinFuncs[BuiltinFunction::JavascriptString_FromCodePoint] = library->AddFunctionToLibraryObject(stringConstructor, PropertyIds::fromCodePoint, &JavascriptString::EntryInfo::FromCodePoint, 1);
        }

        /* No inlining                String_Raw           */ library->AddFunctionToLibraryObject(stringConstructor, PropertyIds::raw,           &JavascriptString::EntryInfo::Raw,           1);

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        stringConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }